

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void prvTidyInsertNodeAtStart(Node *element,Node *node)

{
  Node *pNVar1;
  Node **ppNVar2;
  
  node->parent = element;
  pNVar1 = element->content;
  ppNVar2 = &pNVar1->prev;
  if (pNVar1 == (Node *)0x0) {
    ppNVar2 = &element->last;
  }
  *ppNVar2 = node;
  node->next = pNVar1;
  node->prev = (Node *)0x0;
  element->content = node;
  return;
}

Assistant:

void TY_(InsertNodeAtStart)(Node *element, Node *node)
{
    node->parent = element;

    if (element->content == NULL)
        element->last = node;
    else
        element->content->prev = node;

    node->next = element->content;
    node->prev = NULL;
    element->content = node;
}